

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O0

void icu_63::number::impl::blueprint_helpers::generateDigitsStem
               (int32_t minSig,int32_t maxSig,UnicodeString *sb,UErrorCode *param_4)

{
  UErrorCode *param_3_local;
  UnicodeString *sb_local;
  int32_t maxSig_local;
  int32_t minSig_local;
  
  anon_unknown.dwarf_151918::appendMultiple(sb,0x40,minSig);
  if (maxSig == -1) {
    UnicodeString::append(sb,L'+');
  }
  else {
    anon_unknown.dwarf_151918::appendMultiple(sb,0x23,maxSig - minSig);
  }
  return;
}

Assistant:

void
blueprint_helpers::generateDigitsStem(int32_t minSig, int32_t maxSig, UnicodeString& sb, UErrorCode&) {
    appendMultiple(sb, u'@', minSig);
    if (maxSig == -1) {
        sb.append(u'+');
    } else {
        appendMultiple(sb, u'#', maxSig - minSig);
    }
}